

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_builder.hpp
# Opt level: O3

node_type * __thiscall
pico_tree::internal::
build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::space_map<pico_tree::point_map<double,2ul>>>,pico_tree::max_leaf_size_t,pico_tree::sliding_midpoint_max_side_t,pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,double>,2ul>>
::create_node<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::space_map<pico_tree::point_map<double,2ul>>>,pico_tree::max_leaf_size_t,pico_tree::sliding_midpoint_max_side_t,pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,double>,2ul>>
           *this,index_type depth,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,box_type *box)

{
  double *pdVar1;
  undefined8 uVar2;
  double *pdVar3;
  bool bVar4;
  node_type *pnVar5;
  undefined8 *puVar6;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __nth;
  node_type *pnVar7;
  bool bVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  size_type sVar12;
  build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::space_map<pico_tree::point_map<double,2ul>>>,pico_tree::max_leaf_size_t,pico_tree::sliding_midpoint_max_side_t,pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,double>,2ul>>
  *pbVar13;
  long lVar14;
  ulong uVar15;
  box_type *pbVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  double dVar21;
  double dVar22;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Jaybro[P]pico_tree_src_pico_tree_pico_tree_internal_kd_tree_builder_hpp:261:11)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Jaybro[P]pico_tree_src_pico_tree_pico_tree_internal_kd_tree_builder_hpp:271:11)>
  __comp_00;
  size_type split_dim;
  scalar_type split_val;
  box_type right;
  size_type local_78;
  double local_70;
  undefined1 local_68 [16];
  double *local_58;
  double dStack_50;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::space_map<pico_tree::point_map<double,2ul>>>,pico_tree::max_leaf_size_t,pico_tree::sliding_midpoint_max_side_t,pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,double>,2ul>>
  *local_40;
  node_type *local_38;
  
  lVar10 = *(long *)(this + 0x20);
  lVar9 = *(long *)(lVar10 + 0x10);
  if (lVar9 == 0x100) {
    puVar6 = (undefined8 *)operator_new(0x2808);
    *puVar6 = *(undefined8 *)(lVar10 + 8);
    *(undefined8 **)(lVar10 + 8) = puVar6;
    puVar6 = puVar6 + 1;
    *(undefined8 **)(lVar10 + 0x18) = puVar6;
    lVar9 = 0;
  }
  else {
    puVar6 = *(undefined8 **)(lVar10 + 0x18);
  }
  local_38 = (node_type *)(puVar6 + lVar9 * 5);
  *(long *)(lVar10 + 0x10) = lVar9 + 1;
  uVar15 = (long)end._M_current - (long)begin._M_current >> 2;
  local_78 = (size_type)*(int *)(this + 8);
  if ((long)uVar15 <= (long)local_78) {
    lVar10 = **(long **)(this + 0x18);
    (local_38->data).branch.split_dim = (int)((ulong)((long)begin._M_current - lVar10) >> 2);
    (local_38->data).leaf.end_idx = (int)((ulong)((long)end._M_current - lVar10) >> 2);
    (local_38->super_kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_double>_>).
    left = (kd_tree_node_euclidean<int,_double> *)0x0;
    (local_38->super_kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_double>_>).
    right = (kd_tree_node_euclidean<int,_double> *)0x0;
    (box->storage_).coords_min._M_elems[0] = 1.79769313486232e+308;
    (box->storage_).coords_min._M_elems[1] = 1.79769313486232e+308;
    (box->storage_).coords_max._M_elems[0] = -1.79769313486232e+308;
    (box->storage_).coords_max._M_elems[1] = -1.79769313486232e+308;
    if (end._M_current <= begin._M_current) {
      return local_38;
    }
    lVar10 = *(long *)**(undefined8 **)this;
    do {
      lVar9 = (long)*begin._M_current * 0x10 + lVar10;
      lVar14 = 0;
      bVar4 = true;
      do {
        bVar11 = bVar4;
        dVar22 = *(double *)(lVar9 + lVar14 * 8);
        uVar18 = SUB84(dVar22,0);
        uVar20 = (undefined4)((ulong)dVar22 >> 0x20);
        if (dVar22 < (box->storage_).coords_min._M_elems[lVar14]) {
          (box->storage_).coords_min._M_elems[lVar14] = dVar22;
          uVar2 = *(undefined8 *)(lVar9 + lVar14 * 8);
          uVar18 = (undefined4)uVar2;
          uVar20 = (undefined4)((ulong)uVar2 >> 0x20);
        }
        pdVar1 = (box->storage_).coords_max._M_elems + lVar14;
        if (*pdVar1 <= (double)CONCAT44(uVar20,uVar18) && (double)CONCAT44(uVar20,uVar18) != *pdVar1
           ) {
          (box->storage_).coords_max._M_elems[lVar14] = (double)CONCAT44(uVar20,uVar18);
        }
        lVar14 = 1;
        bVar4 = false;
      } while (bVar11);
      begin._M_current = begin._M_current + 1;
    } while (begin._M_current < end._M_current);
    return local_38;
  }
  uVar17 = 0xffffffff;
  uVar19 = 0xffefffff;
  sVar12 = 0;
  uVar18 = uVar17;
  uVar20 = uVar19;
  bVar4 = true;
  do {
    bVar8 = bVar4;
    dVar22 = (box->storage_).coords_max._M_elems[sVar12] -
             (box->storage_).coords_min._M_elems[sVar12];
    bVar4 = dVar22 != (double)CONCAT44(uVar20,uVar18);
    bVar11 = (double)CONCAT44(uVar20,uVar18) <= dVar22;
    if (bVar11 && bVar4) {
      local_78 = sVar12;
    }
    dVar21 = dVar22;
    if ((NAN(dVar22) || NAN((double)CONCAT44(uVar20,uVar18))) || (!bVar11 || !bVar4)) {
      dVar21 = (double)CONCAT44(uVar19,uVar17);
    }
    if (dVar22 <= (double)CONCAT44(uVar20,uVar18)) {
      dVar22 = (double)CONCAT44(uVar20,uVar18);
    }
    sVar12 = 1;
    uVar17 = SUB84(dVar21,0);
    uVar19 = (undefined4)((ulong)dVar21 >> 0x20);
    uVar18 = SUB84(dVar22,0);
    uVar20 = (undefined4)((ulong)dVar22 >> 0x20);
    bVar4 = false;
  } while (bVar8);
  pbVar13 = this + 0x10;
  local_68._8_8_ = &local_78;
  local_70 = dVar21 * 0.5 + (box->storage_).coords_min._M_elems[local_78];
  local_58 = &local_70;
  local_68._0_8_ = pbVar13;
  local_40 = this;
  __nth = std::operator()(begin._M_current,end._M_current);
  if (__nth._M_current == end._M_current) {
    __nth._M_current = __nth._M_current + -1;
    if (begin._M_current != end._M_current) {
      lVar10 = 0x3f;
      if (uVar15 != 0) {
        for (; uVar15 >> lVar10 == 0; lVar10 = lVar10 + -1) {
        }
      }
      __comp._M_comp.split_dim = &local_78;
      __comp._M_comp.this =
           (splitter_sliding_midpoint_max_side<pico_tree::internal::space_wrapper<pico_tree::space_map<pico_tree::point_map<double,_2UL>_>_>_>
            *)pbVar13;
      std::operator()(begin,__nth,end,(ulong)(((uint)lVar10 ^ 0x3f) * 2) ^ 0x7e,__comp);
    }
  }
  else {
    if (__nth._M_current != begin._M_current) {
      uVar18 = SUB84(local_70,0);
      uVar20 = (undefined4)((ulong)local_70 >> 0x20);
      goto LAB_00101de2;
    }
    __nth._M_current = __nth._M_current + 1;
    if (__nth._M_current != end._M_current && begin._M_current != end._M_current) {
      lVar10 = 0x3f;
      if (uVar15 != 0) {
        for (; uVar15 >> lVar10 == 0; lVar10 = lVar10 + -1) {
        }
      }
      __comp_00._M_comp.split_dim = &local_78;
      __comp_00._M_comp.this =
           (splitter_sliding_midpoint_max_side<pico_tree::internal::space_wrapper<pico_tree::space_map<pico_tree::point_map<double,_2UL>_>_>_>
            *)pbVar13;
      std::operator()(begin,__nth,end,(ulong)(((uint)lVar10 ^ 0x3f) * 2) ^ 0x7e,__comp_00);
    }
  }
  local_70 = *(double *)((long)*__nth._M_current * 0x10 + **(long **)pbVar13 + local_78 * 8);
  uVar18 = SUB84(local_70,0);
  uVar20 = (undefined4)((ulong)local_70 >> 0x20);
LAB_00101de2:
  local_68._0_8_ = (box->storage_).coords_min._M_elems[0];
  local_68._8_8_ = (box->storage_).coords_min._M_elems[1];
  local_58 = (double *)(box->storage_).coords_max._M_elems[0];
  dStack_50 = (box->storage_).coords_max._M_elems[1];
  (box->storage_).coords_max._M_elems[local_78] = (double)CONCAT44(uVar20,uVar18);
  local_48._M_current = __nth._M_current;
  *(ulong *)(local_68 + local_78 * 8) = CONCAT44(uVar20,uVar18);
  pbVar13 = local_40;
  pnVar7 = create_node<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                     (local_40,depth + 1,begin,__nth,box);
  pnVar5 = local_38;
  (local_38->super_kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_double>_>).
  left = pnVar7;
  pnVar7 = create_node<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                     (pbVar13,depth + 1,local_48,end,(box_type *)local_68);
  (pnVar5->super_kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_double>_>).right
       = pnVar7;
  (pnVar5->data).branch.split_dim = (int)local_78;
  (pnVar5->data).branch.left_max = (box->storage_).coords_max._M_elems[local_78];
  (pnVar5->data).branch.right_min = *(double *)(local_68 + local_78 * 8);
  lVar10 = 0;
  pbVar16 = (box_type *)local_68;
  bVar4 = true;
  do {
    bVar11 = bVar4;
    dVar22 = (pbVar16->storage_).coords_min._M_elems[0];
    if (dVar22 < (box->storage_).coords_min._M_elems[lVar10]) {
      (box->storage_).coords_min._M_elems[lVar10] = dVar22;
    }
    pdVar3 = (&local_58)[lVar10];
    pdVar1 = (box->storage_).coords_max._M_elems + lVar10;
    if (*pdVar1 <= (double)pdVar3 && (double)pdVar3 != *pdVar1) {
      (box->storage_).coords_max._M_elems[lVar10] = (double)pdVar3;
    }
    lVar10 = 1;
    pbVar16 = (box_type *)(local_68 + 8);
    bVar4 = false;
  } while (bVar11);
  return pnVar5;
}

Assistant:

inline node_type* create_node(
      index_type const depth,
      RandomAccessIterator_ begin,
      RandomAccessIterator_ end,
      box_type& box) const {
    node_type* node = allocator_.allocate();

    if (is_leaf(depth, begin, end)) {
      node->set_leaf(
          static_cast<index_type>(begin - indices_.begin()),
          static_cast<index_type>(end - indices_.begin()));
      // Keep the original box in case it is empty. This can only happen with
      // the midpoint split.
      if constexpr (std::is_same_v<Rule_, midpoint_max_side_t>) {
        if (begin < end) {
          compute_bounding_box(begin, end, box);
        }
      } else {
        compute_bounding_box(begin, end, box);
      }
    } else {
      // split equals end for the left branch and begin for the right branch.
      RandomAccessIterator_ split;
      size_type split_dim;
      scalar_type split_val;
      splitter_(depth, begin, end, box, split, split_dim, split_val);

      box_type right = box;
      // Argument box will function as the left bounding box until we merge
      // left and right again at the end of this code section.
      box.max(split_dim) = split_val;
      right.min(split_dim) = split_val;

      node->left = create_node(depth + 1, begin, split, box);
      node->right = create_node(depth + 1, split, end, right);

      node->set_branch(box, right, split_dim);

      // Merges both child boxes. We can expect any of the min max values to
      // change except for the ones of split_dim.
      box.fit(right);
    }

    return node;
  }